

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O0

void __thiscall
wabt::interp::
FreeList<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>::Delete
          (FreeList<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>
           *this,Index index)

{
  reference this_00;
  reference local_30;
  unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_> local_20;
  size_type local_18;
  Index index_local;
  FreeList<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>
  *this_local;
  
  local_18 = index;
  index_local = (Index)this;
  std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>::
  unique_ptr<std::default_delete<wabt::interp::Object>,void>
            ((unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>> *)&local_20
            );
  this_00 = std::
            vector<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>,_std::allocator<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>_>
            ::operator[](&this->list_,local_18);
  std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>::operator=
            (this_00,&local_20);
  std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>::~unique_ptr
            (&local_20);
  local_30 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->is_free_,local_18);
  std::_Bit_reference::operator=(&local_30,true);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&this->free_,&local_18);
  return;
}

Assistant:

void FreeList<T>::Delete(Index index) {
  list_[index] = T();
  is_free_[index] = true;
  free_.push_back(index);
}